

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_copyBlockSequences
                 (SeqCollector *seqCollector,seqStore_t *seqStore,U32 *prevRepcodes)

{
  ushort uVar1;
  ushort uVar2;
  uint offBase;
  seqDef *psVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  ZSTD_Sequence *pZVar6;
  size_t sVar7;
  uint uVar8;
  uint *puVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  repcodes_t repcodes;
  int local_60;
  
  psVar3 = seqStore->sequencesStart;
  uVar11 = (long)seqStore->sequences - (long)psVar3 >> 3;
  sVar7 = seqCollector->seqIndex;
  if (seqCollector->maxSequences - sVar7 < uVar11 + 1) {
    sVar7 = 0xffffffffffffffba;
  }
  else {
    pBVar4 = seqStore->lit;
    pBVar5 = seqStore->litStart;
    pZVar6 = seqCollector->seqStart;
    repcodes.rep[2] = prevRepcodes[2];
    repcodes.rep._0_8_ = *(undefined8 *)prevRepcodes;
    puVar9 = &pZVar6[sVar7].rep;
    iVar10 = 0;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      uVar1 = psVar3[uVar12].litLength;
      uVar8 = (uint)uVar1;
      puVar9[-2] = uVar8;
      uVar2 = psVar3[uVar12].mlBase;
      puVar9[-1] = uVar2 + 3;
      *puVar9 = 0;
      if (uVar12 == seqStore->longLengthPos) {
        if (seqStore->longLengthType == ZSTD_llt_matchLength) {
          puVar9[-1] = uVar2 + 0x10003;
          uVar8 = (uint)uVar1;
        }
        else {
          uVar8 = (uint)uVar1;
          if (seqStore->longLengthType == ZSTD_llt_literalLength) {
            puVar9[-2] = uVar1 + 0x10000;
            uVar8 = 1;
          }
        }
      }
      offBase = psVar3[uVar12].offBase;
      if (offBase - 1 < 3) {
        *puVar9 = offBase;
        if (uVar8 == 0) {
          if (offBase == 3) {
            uVar8 = repcodes.rep[0] - 1;
          }
          else {
            uVar8 = repcodes.rep[offBase];
          }
        }
        else {
          uVar8 = repcodes.rep[offBase - 1];
        }
      }
      else {
        uVar8 = offBase - 3;
      }
      ((ZSTD_Sequence *)(puVar9 + -3))->offset = uVar8;
      ZSTD_updateRep(repcodes.rep,offBase,(uint)(uVar1 == 0));
      iVar10 = iVar10 + puVar9[-2];
      puVar9 = puVar9 + 4;
    }
    local_60 = (int)pBVar5;
    pZVar6[sVar7 + uVar11].litLength = (int)pBVar4 - (iVar10 + local_60);
    pZVar6[sVar7 + uVar11].matchLength = 0;
    pZVar6[sVar7 + uVar11].offset = 0;
    seqCollector->seqIndex = uVar11 + 1 + sVar7;
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

static size_t ZSTD_copyBlockSequences(SeqCollector* seqCollector, const seqStore_t* seqStore, const U32 prevRepcodes[ZSTD_REP_NUM])
{
    const seqDef* inSeqs = seqStore->sequencesStart;
    const size_t nbInSequences = seqStore->sequences - inSeqs;
    const size_t nbInLiterals = (size_t)(seqStore->lit - seqStore->litStart);

    ZSTD_Sequence* outSeqs = seqCollector->seqIndex == 0 ? seqCollector->seqStart : seqCollector->seqStart + seqCollector->seqIndex;
    const size_t nbOutSequences = nbInSequences + 1;
    size_t nbOutLiterals = 0;
    repcodes_t repcodes;
    size_t i;

    /* Bounds check that we have enough space for every input sequence
     * and the block delimiter
     */
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);
    RETURN_ERROR_IF(
        nbOutSequences > (size_t)(seqCollector->maxSequences - seqCollector->seqIndex),
        dstSize_tooSmall,
        "Not enough space to copy sequences");

    ZSTD_memcpy(&repcodes, prevRepcodes, sizeof(repcodes));
    for (i = 0; i < nbInSequences; ++i) {
        U32 rawOffset;
        outSeqs[i].litLength = inSeqs[i].litLength;
        outSeqs[i].matchLength = inSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        /* Handle the possible single length >= 64K
         * There can only be one because we add MINMATCH to every match length,
         * and blocks are at most 128K.
         */
        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        /* Determine the raw offset given the offBase, which may be a repcode. */
        if (OFFBASE_IS_REPCODE(inSeqs[i].offBase)) {
            const U32 repcode = OFFBASE_TO_REPCODE(inSeqs[i].offBase);
            assert(repcode > 0);
            outSeqs[i].rep = repcode;
            if (outSeqs[i].litLength != 0) {
                rawOffset = repcodes.rep[repcode - 1];
            } else {
                if (repcode == 3) {
                    assert(repcodes.rep[0] > 1);
                    rawOffset = repcodes.rep[0] - 1;
                } else {
                    rawOffset = repcodes.rep[repcode];
                }
            }
        } else {
            rawOffset = OFFBASE_TO_OFFSET(inSeqs[i].offBase);
        }
        outSeqs[i].offset = rawOffset;

        /* Update repcode history for the sequence */
        ZSTD_updateRep(repcodes.rep,
                       inSeqs[i].offBase,
                       inSeqs[i].litLength == 0);

        nbOutLiterals += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(nbInLiterals >= nbOutLiterals);
    {
        const size_t lastLLSize = nbInLiterals - nbOutLiterals;
        outSeqs[nbInSequences].litLength = (U32)lastLLSize;
        outSeqs[nbInSequences].matchLength = 0;
        outSeqs[nbInSequences].offset = 0;
        assert(nbOutSequences == nbInSequences + 1);
    }
    seqCollector->seqIndex += nbOutSequences;
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);

    return 0;
}